

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  sqlite3_io_methods *psVar5;
  int iVar6;
  unixInodeInfo *puVar7;
  sqlite3_io_methods *psVar8;
  size_t sVar9;
  sqlite3_mutex *psVar10;
  int *piVar11;
  sqlite3_io_methods *psVar12;
  UnixUnusedFd **ppUVar13;
  uint *puVar14;
  uint uVar15;
  uint m;
  int iVar16;
  long lVar17;
  char *zFilename;
  dev_t *pdVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  unixFileId fileId;
  char zDb [513];
  char zTmpname [514];
  uint local_50c;
  uint local_508;
  char local_4d8;
  char cStack_4d7;
  char cStack_4d6;
  char cStack_4d5;
  char cStack_4d4;
  char cStack_4d3;
  char cStack_4d2;
  char cStack_4d1;
  char cStack_4d0;
  char cStack_4cf;
  char cStack_4ce;
  char cStack_4cd;
  char cStack_4cc;
  char cStack_4cb;
  char cStack_4ca;
  char cStack_4c9;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  undefined1 uStack_449;
  undefined8 local_448;
  _func_int_sqlite3_file_ptr *p_Stack_440;
  dev_t local_238;
  ino_t local_230;
  
  uVar20 = flags & 0xffffff00;
  if (((flags & 4U) == 0) ||
     (((bVar2 = true, uVar20 != 0x800 && (uVar20 != 0x4000)) && (uVar20 != 0x80000)))) {
    bVar2 = false;
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pdVar18 = (dev_t *)zPath;
  if (uVar20 == 0x100) {
    iVar6 = (*aSyscall[4].pCurrent)();
    if (iVar6 == 0) {
      if (sqlite3Config.bCoreMutex == 0) {
        psVar10 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar10 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      if (psVar10 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar10);
      }
      if (inodeList == (unixInodeInfo *)0x0) {
        psVar8 = (sqlite3_io_methods *)0x0;
      }
      else {
        psVar8 = (sqlite3_io_methods *)0x0;
        puVar7 = inodeList;
        do {
          if (((puVar7->fileId).dev == local_238) && ((puVar7->fileId).ino == local_230)) {
            psVar8 = (sqlite3_io_methods *)puVar7->pUnused;
            bVar22 = psVar8 == (sqlite3_io_methods *)0x0;
            if (!bVar22) {
              if (*(int *)&psVar8->field_0x4 != flags) goto LAB_00149bed;
              ppUVar13 = &puVar7->pUnused;
              goto LAB_00149c0a;
            }
            break;
          }
          puVar7 = puVar7->pNext;
        } while (puVar7 != (unixInodeInfo *)0x0);
      }
      goto LAB_001497ec;
    }
    psVar8 = (sqlite3_io_methods *)0x0;
    goto LAB_00149812;
  }
  local_50c = 0xffffffff;
  if (zPath == (char *)0x0) {
    iVar6 = unixGetTempname(0x202,(char *)&local_238);
    pdVar18 = &local_238;
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  goto LAB_00149860;
  while (*(int *)&psVar8->field_0x4 != flags) {
LAB_00149bed:
    psVar12 = psVar8;
    psVar8 = (sqlite3_io_methods *)psVar12->xClose;
    bVar22 = psVar8 == (sqlite3_io_methods *)0x0;
    if (bVar22) goto LAB_001497ec;
  }
  ppUVar13 = (UnixUnusedFd **)&psVar12->xClose;
LAB_00149c0a:
  if (!bVar22) {
    *ppUVar13 = (UnixUnusedFd *)psVar8->xClose;
  }
LAB_001497ec:
  if (sqlite3Config.bCoreMutex == 0) {
    psVar10 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar10 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar10 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar10);
  }
LAB_00149812:
  if (psVar8 == (sqlite3_io_methods *)0x0) {
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      psVar8 = (sqlite3_io_methods *)sqlite3Malloc(0x10);
    }
    else {
      psVar8 = (sqlite3_io_methods *)0x0;
    }
    local_50c = 0xffffffff;
    if (psVar8 != (sqlite3_io_methods *)0x0) goto LAB_00149845;
    local_50c = 0xffffffff;
    bVar22 = false;
  }
  else {
    local_50c = psVar8->iVersion;
LAB_00149845:
    pFile[6].pMethods = psVar8;
    bVar22 = true;
  }
  if (!bVar22) {
    return 7;
  }
LAB_00149860:
  uVar19 = flags & 8;
  local_508 = flags & 1;
  iVar16 = (flags & 4U) * 0x10;
  iVar6 = iVar16 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar6 = iVar16;
  }
  uVar15 = iVar6 + (flags & 2U);
  if ((int)local_50c < 0) {
    if ((flags & 0x80800U) == 0) {
      m = 0x180;
      if (uVar19 == 0) {
        m = 0;
      }
      local_4bc = 0;
      local_4b8 = 0;
LAB_00149b11:
      iVar6 = 0;
    }
    else {
      if (pdVar18 == (dev_t *)0x0) {
        uVar4 = 0;
      }
      else {
        lVar17 = -1;
        do {
          lVar3 = lVar17 + 1;
          lVar17 = lVar17 + 1;
        } while (*(char *)((long)pdVar18 + lVar3) != '\0');
        uVar4 = (ulong)((uint)lVar17 & 0x3fffffff);
      }
      do {
        sVar9 = uVar4;
        uVar4 = sVar9 - 1;
      } while (*(char *)((long)pdVar18 + (sVar9 - 1)) != '-');
      memcpy(&local_448,pdVar18,sVar9 - 1);
      (&uStack_449)[sVar9] = 0;
      iVar6 = (*aSyscall[4].pCurrent)();
      if (iVar6 == 0) {
        m = local_4c0 & 0x1ff;
        goto LAB_00149b11;
      }
      iVar6 = 0x70a;
      m = 0;
      local_4bc = 0;
      local_4b8 = 0;
    }
    iVar21 = 1;
    iVar16 = iVar6;
    if (iVar6 == 0) {
      local_50c = robust_open((char *)pdVar18,uVar15,m);
      if ((((int)local_50c < 0) && (piVar11 = __errno_location(), (flags & 0x12U) == 2)) &&
         (*piVar11 != 0x15)) {
        flags = (flags & 0xffffffe8U) + 1;
        local_50c = robust_open((char *)pdVar18,uVar15 & 0x20080,m);
        local_508 = 1;
      }
      if ((int)local_50c < 0) {
        sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x7061,
                    "118a3b35693b134d56ebd780123b7fd6f1497668");
        puVar14 = (uint *)__errno_location();
        if (pdVar18 == (dev_t *)0x0) {
          pdVar18 = (dev_t *)0x1ad663;
        }
        sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x7061,(ulong)*puVar14,"open",pdVar18,"");
        iVar21 = 2;
        iVar6 = 7;
        iVar16 = 0xe;
      }
      else {
        iVar6 = 7;
        if ((flags & 0x80800U) != 0) {
          (*aSyscall[0x14].pCurrent)((ulong)local_50c,(ulong)local_4bc,(ulong)local_4b8);
        }
        iVar21 = 0;
        iVar16 = 0;
      }
    }
    if (iVar21 == 2) goto LAB_00149dc0;
    if (iVar21 != 0) {
      return iVar6;
    }
  }
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = flags;
  }
  psVar8 = pFile[6].pMethods;
  if (psVar8 != (sqlite3_io_methods *)0x0) {
    psVar8->iVersion = local_50c;
    *(int *)&psVar8->field_0x4 = flags;
  }
  if (uVar19 != 0) {
    (*aSyscall[0x10].pCurrent)();
  }
  uVar15 = uVar19 * 4 + 2;
  if (local_508 == 0) {
    uVar15 = uVar19 * 4;
  }
  uVar19 = uVar15 + 0x80;
  if (uVar20 == 0x100) {
    uVar19 = uVar15;
  }
  uVar20 = uVar19 | 8;
  if (!bVar2) {
    uVar20 = uVar19;
  }
  *(uint *)&pFile[3].pMethods = local_50c;
  pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
  pFile[7].pMethods = (sqlite3_io_methods *)zPath;
  *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar20 & 0xff;
  pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
  zFilename = (char *)0x0;
  if ((flags & 0x40U) != 0 || (uVar20 & 0x40) != 0) {
    zFilename = zPath;
  }
  iVar6 = sqlite3_uri_boolean(zFilename,"psow",1);
  if (iVar6 != 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 0x10;
  }
  iVar6 = strcmp(pVfs->zName,"unix-excl");
  if (iVar6 == 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((char)uVar20 < '\0') {
    psVar8 = &nolockIoMethods;
  }
  else {
    psVar8 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
  }
  if (psVar8 == &posixIoMethods) {
    if (sqlite3Config.bCoreMutex == 0) {
      psVar10 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar10 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar10 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar10);
    }
    iVar6 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_448);
    psVar12 = (sqlite3_io_methods *)inodeList;
    if (iVar6 == 0) {
      for (; psVar12 != (sqlite3_io_methods *)0x0; psVar12 = (sqlite3_io_methods *)psVar12->xLock) {
        local_4d8 = (char)local_448;
        cStack_4d7 = (char)((ulong)local_448 >> 8);
        cStack_4d6 = (char)((ulong)local_448 >> 0x10);
        cStack_4d5 = (char)((ulong)local_448 >> 0x18);
        cStack_4d4 = (char)((ulong)local_448 >> 0x20);
        cStack_4d3 = (char)((ulong)local_448 >> 0x28);
        cStack_4d2 = (char)((ulong)local_448 >> 0x30);
        cStack_4d1 = (char)((ulong)local_448 >> 0x38);
        cStack_4d0 = (char)p_Stack_440;
        cStack_4cf = (char)((ulong)p_Stack_440 >> 8);
        cStack_4ce = (char)((ulong)p_Stack_440 >> 0x10);
        cStack_4cd = (char)((ulong)p_Stack_440 >> 0x18);
        cStack_4cc = (char)((ulong)p_Stack_440 >> 0x20);
        cStack_4cb = (char)((ulong)p_Stack_440 >> 0x28);
        cStack_4ca = (char)((ulong)p_Stack_440 >> 0x30);
        cStack_4c9 = (char)((ulong)p_Stack_440 >> 0x38);
        auVar23[0] = -((char)((unixFileId *)&psVar12->iVersion)->dev == local_4d8);
        auVar23[1] = -(*(char *)((long)&((unixFileId *)&psVar12->iVersion)->dev + 1) == cStack_4d7);
        auVar23[2] = -(*(char *)((long)&((unixFileId *)&psVar12->iVersion)->dev + 2) == cStack_4d6);
        auVar23[3] = -(*(char *)((long)&((unixFileId *)&psVar12->iVersion)->dev + 3) == cStack_4d5);
        auVar23[4] = -(psVar12->field_0x4 == cStack_4d4);
        auVar23[5] = -(psVar12->field_0x5 == cStack_4d3);
        auVar23[6] = -(psVar12->field_0x6 == cStack_4d2);
        auVar23[7] = -(psVar12->field_0x7 == cStack_4d1);
        auVar23[8] = -(*(char *)&psVar12->xClose == cStack_4d0);
        auVar23[9] = -(*(char *)((long)&psVar12->xClose + 1) == cStack_4cf);
        auVar23[10] = -(*(char *)((long)&psVar12->xClose + 2) == cStack_4ce);
        auVar23[0xb] = -(*(char *)((long)&psVar12->xClose + 3) == cStack_4cd);
        auVar23[0xc] = -(*(char *)((long)&psVar12->xClose + 4) == cStack_4cc);
        auVar23[0xd] = -(*(char *)((long)&psVar12->xClose + 5) == cStack_4cb);
        auVar23[0xe] = -(*(char *)((long)&psVar12->xClose + 6) == cStack_4ca);
        auVar23[0xf] = -(*(char *)((long)&psVar12->xClose + 7) == cStack_4c9);
        if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
          *(int *)&psVar12->xWrite = *(int *)&psVar12->xWrite + 1;
          psVar5 = (sqlite3_io_methods *)inodeList;
          goto LAB_00149d46;
        }
      }
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        psVar12 = (sqlite3_io_methods *)sqlite3Malloc(0x48);
      }
      else {
        psVar12 = (sqlite3_io_methods *)0x0;
      }
      if (psVar12 == (sqlite3_io_methods *)0x0) {
        iVar16 = 7;
      }
      else {
        *(undefined1 (*) [16])&psVar12->xFileSize = (undefined1  [16])0x0;
        *(undefined1 (*) [16])&psVar12->xTruncate = (undefined1  [16])0x0;
        psVar12->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        psVar12->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        psVar12->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
        *(undefined8 *)psVar12 = local_448;
        psVar12->xClose = p_Stack_440;
        *(int *)&psVar12->xWrite = 1;
        psVar12->xLock = (_func_int_sqlite3_file_ptr_int *)inodeList;
        psVar12->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
        psVar5 = psVar12;
        if (inodeList != (unixInodeInfo *)0x0) {
          inodeList->pPrev = (unixInodeInfo *)psVar12;
        }
LAB_00149d46:
        inodeList = (unixInodeInfo *)psVar5;
        pFile[2].pMethods = psVar12;
        iVar16 = 0;
      }
    }
    else {
      piVar11 = __errno_location();
      iVar6 = *piVar11;
      *(int *)&pFile[4].pMethods = iVar6;
      iVar16 = 10;
      if (iVar6 == 0x4b) {
        iVar16 = 0x16;
      }
    }
    if (iVar16 != 0) {
      robust_close((unixFile *)pFile,local_50c,0x6e90);
      local_50c = 0xffffffff;
    }
    if (sqlite3Config.bCoreMutex == 0) {
      psVar10 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar10 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar10 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar10);
    }
  }
  else {
    iVar16 = 0;
    if (psVar8 == &dotlockIoMethods) {
      sVar9 = strlen(zPath);
      iVar21 = (int)sVar9 + 6;
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        psVar12 = (sqlite3_io_methods *)sqlite3Malloc(iVar21);
      }
      else {
        psVar12 = (sqlite3_io_methods *)0x0;
      }
      if (psVar12 == (sqlite3_io_methods *)0x0) {
        iVar16 = 7;
      }
      else {
        iVar16 = 0;
        sqlite3_snprintf(iVar21,(char *)psVar12,"%s.lock",zPath);
      }
      pFile[5].pMethods = psVar12;
    }
  }
  *(undefined4 *)&pFile[4].pMethods = 0;
  if (iVar16 == 0) {
    pFile->pMethods = psVar8;
    verifyDbFile((unixFile *)pFile);
  }
  else if (-1 < (int)local_50c) {
    robust_close((unixFile *)pFile,local_50c,0x6ee5);
  }
LAB_00149dc0:
  if (iVar16 != 0) {
    sqlite3_free(pFile[6].pMethods);
  }
  return iVar16;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int syncDir = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM;
      }
    }
    p->pUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !syncDir);
    rc = unixGetTempname(MAX_PATHNAME+2, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    if( fd<0 && errno!=EISDIR && isReadWrite && !isExclusive ){
      /* Failed to open the file for read/write access. Try read-only. */
      flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
      openFlags &= ~(O_RDWR|O_CREAT);
      flags |= SQLITE_OPEN_READONLY;
      openFlags |= O_RDONLY;
      isReadonly = 1;
      fd = robust_open(zName, openFlags, openMode);
    }
    if( fd<0 ){
      rc = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      osFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

  noLock = eType!=SQLITE_OPEN_MAIN_DB;

  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( syncDir )                 ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      if( statfs(zPath, &fsInfo) == -1 ){
        /* In theory, the close(fd) call is sub-optimal. If the file opened
        ** with fd is a database file, and there are other connections open
        ** on that file that are currently holding advisory locks on it,
        ** then the call to close() will cancel those locks. In practice,
        ** we're assuming that statfs() doesn't fail very often. At least
        ** not while other file descriptors opened by the same process on
        ** the same file are working.  */
        p->lastErrno = errno;
        robust_close(p, fd, __LINE__);
        rc = SQLITE_IOERR_ACCESS;
        goto open_finished;
      }
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pUnused);
  }
  return rc;
}